

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu384a_com.c
# Opt level: O0

RK_S32 vdpu384a_check_rcb_buf_size(Vdpu384aRcbInfo *info,RK_S32 width,RK_S32 height)

{
  uint local_1c;
  RK_U32 i;
  RK_S32 height_local;
  RK_S32 width_local;
  Vdpu384aRcbInfo *info_local;
  
  local_1c = 0;
  while( true ) {
    if (8 < local_1c) {
      local_1c = 9;
      while( true ) {
        if (10 < local_1c) {
          return 0;
        }
        if (((int)(height * rcb_coeff[local_1c] + 0x3f & 0xffffffc0) <= info[local_1c].size) &&
           (_mpp_log_l(2,"vdpu384a_com","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "info[i].size < (RK_S32)(((height * rcb_coeff[i])+((64))-1)&~(((64))-1))",
                       "vdpu384a_check_rcb_buf_size",0x49), (mpp_debug & 0x10000000) != 0)) break;
        local_1c = local_1c + 1;
      }
      abort();
    }
    if (((int)(width * rcb_coeff[local_1c] + 0x3f & 0xffffffc0) <= info[local_1c].size) &&
       (_mpp_log_l(2,"vdpu384a_com","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "info[i].size < (RK_S32)(((width * rcb_coeff[i])+((64))-1)&~(((64))-1))",
                   "vdpu384a_check_rcb_buf_size",0x46), (mpp_debug & 0x10000000) != 0)) break;
    local_1c = local_1c + 1;
  }
  abort();
}

Assistant:

RK_RET vdpu384a_check_rcb_buf_size(Vdpu384aRcbInfo *info, RK_S32 width, RK_S32 height)
{
    RK_U32 i;

    for (i = 0; i < RCB_FILTERD_TILE_COL; i++)
        mpp_assert(info[i].size < (RK_S32)MPP_ALIGN(width * rcb_coeff[i], RCB_ALLINE_SIZE));

    for (i = RCB_FILTERD_TILE_COL; i < RCB_BUF_COUNT; i++)
        mpp_assert(info[i].size < (RK_S32)MPP_ALIGN(height * rcb_coeff[i], RCB_ALLINE_SIZE));

    return MPP_OK;
}